

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormat::setCurrencyUsage(DecimalFormat *this,UCurrencyUsage newUsage,UErrorCode *ec)

{
  UCurrencyUsage UVar1;
  UBool UVar2;
  bool bVar3;
  UCurrencyUsage UVar4;
  DecimalFormatProperties *pDVar5;
  UErrorCode *ec_local;
  DecimalFormat *pDStack_10;
  UCurrencyUsage newUsage_local;
  DecimalFormat *this_local;
  
  ec_local._4_4_ = newUsage;
  pDStack_10 = this;
  UVar2 = ::U_FAILURE(*ec);
  if (UVar2 == '\0') {
    pDVar5 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    bVar3 = icu_63::number::impl::NullableValue<UCurrencyUsage>::isNull(&pDVar5->currencyUsage);
    UVar1 = ec_local._4_4_;
    if (!bVar3) {
      pDVar5 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                         ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                          this->fields);
      UVar4 = icu_63::number::impl::NullableValue<UCurrencyUsage>::getNoError
                        (&pDVar5->currencyUsage);
      if (UVar1 == UVar4) {
        return;
      }
    }
    pDVar5 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    icu_63::number::impl::NullableValue<UCurrencyUsage>::operator=
              (&pDVar5->currencyUsage,(UCurrencyUsage *)((long)&ec_local + 4));
    touch(this,ec);
  }
  return;
}

Assistant:

void DecimalFormat::setCurrencyUsage(UCurrencyUsage newUsage, UErrorCode* ec) {
    if (U_FAILURE(*ec)) {
        return;
    }
    if (!fields->properties->currencyUsage.isNull() && newUsage == fields->properties->currencyUsage.getNoError()) {
        return;
    }
    fields->properties->currencyUsage = newUsage;
    touch(*ec);
}